

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O3

void pzshape::TPZShapePiram::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar17 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  TPZStack<int,_10> lowersides;
  TPZGenMatrix<int> local_d8;
  TPZManVector<long,_4> local_c0;
  ulong local_80;
  TPZManVector<int,_10> local_78;
  
  if (side < 5) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                 ,0x1c2);
    }
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar4 = 1;
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar4 = 0;
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar4 = 0;
  }
  else if ((uint)side < 0xd) {
    if (shapeorders->fRows != (long)(int)(order - 1U)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                 ,0x1cd);
    }
    if (1 < order) {
      uVar10 = 0;
      do {
        piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,0);
        *piVar4 = (int)uVar10 + 2;
        uVar10 = uVar10 + 1;
      } while (order - 1U != uVar10);
    }
  }
  else {
    if (side == 0xd) {
      iVar5 = order + -1;
      uVar6 = iVar5 * iVar5;
      if (shapeorders->fRows != (ulong)uVar6) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x1d9);
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
      pztopology::TPZPyramid::LowerDimensionSides(0xd,(TPZStack<int,_10> *)&local_78);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,0xd);
      iVar2 = pztopology::TPZPyramid::NSideNodes(0xd);
      TPZManVector<long,_4>::TPZManVector(&local_c0,(long)iVar2);
      if (0 < local_c0.super_TPZVec<long>.fNElements) {
        lVar9 = 0;
        do {
          iVar2 = pztopology::TPZPyramid::ContainedSideLocId(0xd,(int)lVar9);
          local_c0.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar2];
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_c0.super_TPZVec<long>.fNElements);
      }
      TPZGenMatrix<int>::TPZGenMatrix(&local_d8,(ulong)uVar6,3);
      TPZShapeQuad::SideShapeOrder(8,&local_c0.super_TPZVec<long>,order,&local_d8);
      if (iVar5 != 0) {
        uVar10 = 1;
        if (1 < uVar6) {
          uVar10 = (ulong)uVar6;
        }
        i = 0;
        do {
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,i,0);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,i,0);
          *piVar4 = iVar5;
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,i,1);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,i,1);
          *piVar4 = iVar5;
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,i,2);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,i,2);
          *piVar4 = iVar5;
          i = i + 1;
        } while (uVar10 != i);
      }
    }
    else {
      uVar6 = order - 2;
      if (0x11 < (uint)side) {
        if (order < 3) {
          uVar10 = 0;
        }
        else {
          uVar3 = order + 1U & 0xfffffffc;
          uVar14 = order - 3;
          uVar11 = 0;
          uVar12 = 1;
          uVar13 = 2;
          uVar1 = 3;
          uVar16 = 0;
          uVar19 = 0;
          uVar21 = 0;
          uVar23 = 0;
          do {
            uVar22 = uVar23;
            uVar20 = uVar21;
            uVar18 = uVar19;
            uVar15 = uVar16;
            uVar27 = uVar1;
            uVar26 = uVar13;
            uVar25 = uVar12;
            uVar24 = uVar11;
            auVar17._0_4_ = uVar24 + 1;
            auVar17._4_4_ = uVar25 + 1;
            auVar17._8_4_ = uVar26 + 1;
            auVar17._12_4_ = uVar27 + 1;
            auVar28._4_4_ = uVar25 + 2;
            auVar28._12_4_ = uVar27 + 2;
            auVar28._0_4_ = auVar28._4_4_;
            auVar28._8_4_ = auVar28._12_4_;
            uVar16 = (auVar17._0_4_ * (uVar24 + 2) >> 1) + uVar15;
            uVar19 = ((uint)(auVar28._4_4_ * auVar17._4_4_) >> 1) + uVar18;
            uVar21 = ((uint)((auVar17._8_8_ & 0xffffffff) * (ulong)(uVar26 + 2)) >> 1) + uVar20;
            uVar23 = ((uint)((auVar28._8_8_ & 0xffffffff) * (ulong)auVar17._12_4_) >> 1) + uVar22;
            uVar3 = uVar3 - 4;
            uVar11 = uVar24 + 4;
            uVar12 = uVar25 + 4;
            uVar13 = uVar26 + 4;
            uVar1 = uVar27 + 4;
          } while (uVar3 != 0);
          uVar11 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar24 ^ 0x80000000));
          uVar12 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar25 ^ 0x80000000));
          uVar13 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
          uVar14 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar27 ^ 0x80000000));
          uVar10 = (ulong)((~uVar14 & uVar23 | uVar22 & uVar14) +
                           (~uVar12 & uVar19 | uVar18 & uVar12) +
                          (~uVar13 & uVar21 | uVar20 & uVar13) +
                          (~uVar11 & uVar16 | uVar15 & uVar11));
        }
        if (shapeorders->fRows == uVar10) {
          if (order < 3) {
            return;
          }
          local_80 = 0;
          iVar5 = 3;
          iVar2 = 0;
          do {
            uVar11 = 0;
            iVar8 = iVar5;
            uVar14 = uVar6;
            iVar7 = iVar5;
            do {
              do {
                if (iVar8 + -3 < (int)uVar6) {
                  lVar9 = (long)iVar2;
                  piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,0);
                  *piVar4 = iVar8;
                  piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,1);
                  *piVar4 = iVar8;
                  piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,2);
                  *piVar4 = iVar8;
                  iVar2 = iVar2 + 1;
                }
                uVar14 = uVar14 - 1;
                iVar8 = iVar8 + 1;
              } while (uVar14 != 0);
              uVar11 = uVar11 + 1;
              iVar8 = iVar7 + 1;
              uVar14 = uVar6;
              iVar7 = iVar8;
            } while (uVar11 != uVar6);
            uVar14 = (int)local_80 + 1;
            local_80 = (ulong)uVar14;
            iVar5 = iVar5 + 1;
          } while (uVar14 != uVar6);
          return;
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x220);
      }
      iVar5 = uVar6 * (order + -1);
      uVar6 = iVar5 / 2;
      if (shapeorders->fRows != (long)(int)uVar6) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x1fd);
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
      pztopology::TPZPyramid::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_78);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,side);
      iVar2 = pztopology::TPZPyramid::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&local_c0,(long)iVar2);
      if (0 < local_c0.super_TPZVec<long>.fNElements) {
        lVar9 = 0;
        do {
          iVar2 = pztopology::TPZPyramid::ContainedSideLocId(side,(int)lVar9);
          local_c0.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar2];
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_c0.super_TPZVec<long>.fNElements);
      }
      TPZGenMatrix<int>::TPZGenMatrix(&local_d8,(long)(int)uVar6,3);
      TPZShapeTriang::SideShapeOrder(6,&local_c0.super_TPZVec<long>,order,&local_d8);
      if (1 < iVar5) {
        uVar10 = 0;
        do {
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,0);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,0);
          *piVar4 = iVar5;
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,1);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,1);
          *piVar4 = iVar5;
          piVar4 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,2);
          iVar5 = *piVar4;
          piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,2);
          *piVar4 = iVar5;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&local_d8);
    if (local_c0.super_TPZVec<long>.fStore != local_c0.fExtAlloc) {
      local_c0.super_TPZVec<long>.fNAlloc = 0;
      local_c0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_c0.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_c0.super_TPZVec<long>.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
  }
  return;
}

Assistant:

void TPZShapePiram::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=4)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=5 && side<=12)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 13)
        {
            // quadrilatero
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else if (side >= 14 && side <= 17)
        {
            //triangulos
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {
            // interno
            int totsum = 0;
            for(int i=0;i<order - 2;i++) {
                totsum += (i+1)*(i+2) / 2;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-2;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int soma = i+j+k;
                        if( i+j+k < ord ) // Duvida
                        {
                            shapeorders(count,0) = 3 + soma;
                            shapeorders(count,1) = 3 + soma;
                            shapeorders(count,2) = 3 + soma;
                            count++;
                        }
                    }
                }
            }
        }

    }